

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

void __thiscall
eglu::anon_unknown_1::RenderContext::create
          (RenderContext *this,NativeDisplayFactory *displayFactory,
          NativeWindowFactory *windowFactory,NativePixmapFactory *pixmapFactory,RenderConfig *config
          )

{
  Library *egl_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  uint uVar5;
  ApiType other;
  undefined4 extraout_var;
  EGLDisplay pvVar6;
  undefined4 extraout_var_00;
  EGLConfig pvVar7;
  NotSupportedError *pNVar8;
  EGLSurface pvVar9;
  InternalError *this_00;
  EGLContext pvVar10;
  DynamicLibrary *this_01;
  RenderTarget local_17c;
  undefined1 local_158 [8];
  PixelFormat pixelFmt;
  EGLint numSamples;
  EGLint stencilBits;
  EGLint depthBits;
  EGLint height;
  EGLint width;
  GetProcFuncLoader extLoader;
  undefined1 local_118 [8];
  DynamicFuncLoader funcLoader_1;
  char *local_100;
  char *libraryPath;
  ApiType local_f0;
  deUint32 local_ec;
  ApiType local_e8;
  deUint32 local_e4;
  undefined1 local_e0 [8];
  GetProcFuncLoader funcLoader;
  string local_c8;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  PixmapSurfacePair pixmapSurface;
  WindowSurfacePair windowSurface;
  undefined4 local_48;
  EGLint supportedTypes;
  EGLint minor;
  EGLint major;
  Library *egl;
  RenderConfig *pRStack_30;
  SurfaceType surfaceType;
  RenderConfig *config_local;
  NativePixmapFactory *pixmapFactory_local;
  NativeWindowFactory *windowFactory_local;
  NativeDisplayFactory *displayFactory_local;
  RenderContext *this_local;
  
  egl._4_4_ = config->surfaceType;
  pRStack_30 = config;
  config_local = (RenderConfig *)pixmapFactory;
  pixmapFactory_local = (NativePixmapFactory *)windowFactory;
  windowFactory_local = (NativeWindowFactory *)displayFactory;
  displayFactory_local = (NativeDisplayFactory *)this;
  iVar2 = (*(displayFactory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                    (displayFactory,0);
  this->m_display = (NativeDisplay *)CONCAT44(extraout_var,iVar2);
  pvVar6 = getDisplay(this->m_display);
  this->m_eglDisplay = pvVar6;
  iVar2 = (*this->m_display->_vptr_NativeDisplay[2])();
  _minor = (Library *)CONCAT44(extraout_var_00,iVar2);
  supportedTypes = 0;
  local_48 = 0;
  do {
    (*_minor->_vptr_Library[0x25])(_minor,this->m_eglDisplay,&supportedTypes,&local_48);
    dVar3 = (*_minor->_vptr_Library[0x1f])();
    checkError(dVar3,"initialize(m_eglDisplay, &major, &minor)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x142);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pvVar7 = chooseConfig(_minor,this->m_eglDisplay,pRStack_30);
  this->m_eglConfig = pvVar7;
  if (egl._4_4_ == SURFACETYPE_DONT_CARE) {
    uVar5 = getConfigAttribInt(_minor,this->m_eglDisplay,this->m_eglConfig,0x3033);
    if ((uVar5 & 4) == 0) {
      if ((uVar5 & 1) == 0) {
        if ((uVar5 & 2) == 0) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar8,"Selected EGL config doesn\'t support any surface types",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                     ,0x153);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        egl._4_4_ = SURFACETYPE_OFFSCREEN_NATIVE;
      }
      else {
        egl._4_4_ = SURFACETYPE_OFFSCREEN_GENERIC;
      }
    }
    else {
      egl._4_4_ = SURFACETYPE_WINDOW;
    }
  }
  if (egl._4_4_ == SURFACETYPE_WINDOW) {
    if (pixmapFactory_local == (NativePixmapFactory *)0x0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"EGL platform doesn\'t support windows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x161);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    join_0x00000010_0x00000000_ =
         createWindow(this->m_display,(NativeWindowFactory *)pixmapFactory_local,this->m_eglDisplay,
                      this->m_eglConfig,pRStack_30);
    this->m_window = (NativeWindow *)pixmapSurface.second;
    this->m_eglSurface = windowSurface.first;
  }
  else if (egl._4_4_ == SURFACETYPE_OFFSCREEN_NATIVE) {
    if (config_local == (RenderConfig *)0x0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"EGL platform doesn\'t support pixmaps",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x16e);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    _local_80 = createPixmap(this->m_display,(NativePixmapFactory *)config_local,this->m_eglDisplay,
                             this->m_eglConfig,pRStack_30);
    this->m_pixmap = (NativePixmap *)local_80;
    this->m_eglSurface = pixmapSurface.first;
  }
  else {
    if (egl._4_4_ != SURFACETYPE_OFFSCREEN_GENERIC) {
      local_a2 = 1;
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Invalid surface type",&local_a1);
      tcu::InternalError::InternalError(this_00,&local_a0);
      local_a2 = 0;
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    pvVar9 = createPBuffer(_minor,this->m_eglDisplay,this->m_eglConfig,pRStack_30);
    this->m_eglSurface = pvVar9;
  }
  pvVar10 = createGLContext(_minor,this->m_eglDisplay,this->m_eglConfig,&pRStack_30->type,
                            pRStack_30->resetNotificationStrategy);
  this->m_eglContext = pvVar10;
  do {
    (*_minor->_vptr_Library[0x27])
              (_minor,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar3 = (*_minor->_vptr_Library[0x1f])();
    checkError(dVar3,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x17c);
    dVar4 = ::deGetFalse();
    egl_00 = _minor;
  } while (dVar4 != 0);
  pvVar6 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"EGL_KHR_get_all_proc_addresses",
             (allocator<char> *)((long)&funcLoader.m_egl + 7));
  bVar1 = hasExtension(egl_00,pvVar6,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&funcLoader.m_egl + 7));
  if (bVar1) {
    GetProcFuncLoader::GetProcFuncLoader((GetProcFuncLoader *)local_e0,_minor);
    local_e4 = (deUint32)glu::ContextType::getAPI(&pRStack_30->type);
    glu::initCoreFunctions(&this->m_glFunctions,(FunctionLoader *)local_e0,(ApiType)local_e4);
  }
  else {
    local_e8 = glu::ContextType::getAPI(&pRStack_30->type);
    local_ec = (deUint32)glu::ApiType::es(2,0);
    bVar1 = glu::ApiType::operator==(&local_e8,(ApiType)local_ec);
    if (bVar1) {
      glw::initES20Direct(&this->m_glFunctions);
    }
    else {
      local_f0 = glu::ContextType::getAPI(&pRStack_30->type);
      other = glu::ApiType::es(3,0);
      bVar1 = glu::ApiType::operator==(&local_f0,other);
      if (bVar1) {
        glw::initES30Direct(&this->m_glFunctions);
      }
      else {
        funcLoader_1.m_library._4_4_ = (pRStack_30->type).super_ApiType.m_bits;
        bVar1 = glu::isContextTypeES((ContextType)funcLoader_1.m_library._4_4_);
        if (bVar1) {
          glu::ApiType::getMinorVersion((ApiType *)pRStack_30);
          local_100 = "libGLESv2.so";
        }
        else {
          local_100 = "libGL.so";
        }
        this_01 = (DynamicLibrary *)operator_new(8);
        de::DynamicLibrary::DynamicLibrary(this_01,local_100);
        this->m_dynamicGLLibrary = this_01;
        DynamicFuncLoader::DynamicFuncLoader
                  ((DynamicFuncLoader *)local_118,this->m_dynamicGLLibrary);
        extLoader.m_egl._4_4_ = glu::ContextType::getAPI(&pRStack_30->type);
        glu::initCoreFunctions
                  (&this->m_glFunctions,(FunctionLoader *)local_118,extLoader.m_egl._4_4_);
      }
    }
  }
  GetProcFuncLoader::GetProcFuncLoader((GetProcFuncLoader *)&width,_minor);
  height = (EGLint)glu::ContextType::getAPI(&pRStack_30->type);
  glu::initExtensionFunctions(&this->m_glFunctions,(FunctionLoader *)&width,(ApiType)height);
  tcu::PixelFormat::PixelFormat((PixelFormat *)local_158);
  (*_minor->_vptr_Library[0x2b])(_minor,this->m_eglDisplay,this->m_eglSurface,0x3057,&depthBits);
  (*_minor->_vptr_Library[0x2b])(_minor,this->m_eglDisplay,this->m_eglSurface,0x3056,&stencilBits);
  (*_minor->_vptr_Library[0x19])(_minor,this->m_eglDisplay,this->m_eglConfig,0x3024,local_158);
  (*_minor->_vptr_Library[0x19])(_minor,this->m_eglDisplay,this->m_eglConfig,0x3023,local_158 + 4);
  (*_minor->_vptr_Library[0x19])(_minor,this->m_eglDisplay,this->m_eglConfig,0x3022,&pixelFmt);
  (*_minor->_vptr_Library[0x19])
            (_minor,this->m_eglDisplay,this->m_eglConfig,0x3021,&pixelFmt.greenBits);
  (*_minor->_vptr_Library[0x19])(_minor,this->m_eglDisplay,this->m_eglConfig,0x3025,&numSamples);
  (*_minor->_vptr_Library[0x19])
            (_minor,this->m_eglDisplay,this->m_eglConfig,0x3026,&pixelFmt.alphaBits);
  (*_minor->_vptr_Library[0x19])
            (_minor,this->m_eglDisplay,this->m_eglConfig,0x3031,&pixelFmt.blueBits);
  dVar3 = (*_minor->_vptr_Library[0x1f])();
  checkError(dVar3,"Failed to query config attributes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x1c8);
  tcu::RenderTarget::RenderTarget
            (&local_17c,depthBits,stencilBits,(PixelFormat *)local_158,numSamples,pixelFmt.alphaBits
             ,pixelFmt.blueBits);
  memcpy(&this->m_glRenderTarget,&local_17c,0x24);
  tcu::RenderTarget::~RenderTarget(&local_17c);
  return;
}

Assistant:

void RenderContext::create (const NativeDisplayFactory* displayFactory, const NativeWindowFactory* windowFactory, const NativePixmapFactory* pixmapFactory, const glu::RenderConfig& config)
{
	glu::RenderConfig::SurfaceType	surfaceType	= config.surfaceType;

	DE_ASSERT(displayFactory);

	m_display		= displayFactory->createDisplay();
	m_eglDisplay	= eglu::getDisplay(*m_display);

	const Library& egl = m_display->getLibrary();

	{
		EGLint major = 0;
		EGLint minor = 0;
		EGLU_CHECK_CALL(egl, initialize(m_eglDisplay, &major, &minor));
	}

	m_eglConfig	= chooseConfig(egl, m_eglDisplay, config);

	if (surfaceType == glu::RenderConfig::SURFACETYPE_DONT_CARE)
	{
		// Choose based on what selected configuration supports
		const EGLint supportedTypes = eglu::getConfigAttribInt(egl, m_eglDisplay, m_eglConfig, EGL_SURFACE_TYPE);

		if ((supportedTypes & EGL_WINDOW_BIT) != 0)
			surfaceType = glu::RenderConfig::SURFACETYPE_WINDOW;
		else if ((supportedTypes & EGL_PBUFFER_BIT) != 0)
			surfaceType = glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;
		else if ((supportedTypes & EGL_PIXMAP_BIT) != 0)
			surfaceType = glu::RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE;
		else
			throw tcu::NotSupportedError("Selected EGL config doesn't support any surface types", DE_NULL, __FILE__, __LINE__);
	}

	switch (surfaceType)
	{
		case glu::RenderConfig::SURFACETYPE_WINDOW:
		{
			if (windowFactory)
			{
				const WindowSurfacePair windowSurface = createWindow(m_display, windowFactory, m_eglDisplay, m_eglConfig, config);
				m_window		= windowSurface.first;
				m_eglSurface	= windowSurface.second;
			}
			else
				throw tcu::NotSupportedError("EGL platform doesn't support windows", DE_NULL, __FILE__, __LINE__);
			break;
		}

		case glu::RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE:
		{
			if (pixmapFactory)
			{
				const PixmapSurfacePair pixmapSurface = createPixmap(m_display, pixmapFactory, m_eglDisplay, m_eglConfig, config);
				m_pixmap		= pixmapSurface.first;
				m_eglSurface	= pixmapSurface.second;
			}
			else
				throw tcu::NotSupportedError("EGL platform doesn't support pixmaps", DE_NULL, __FILE__, __LINE__);
			break;
		}

		case glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC:
			m_eglSurface = createPBuffer(egl, m_eglDisplay, m_eglConfig, config);
			break;

		default:
			throw tcu::InternalError("Invalid surface type");
	}

	m_eglContext = createGLContext(egl, m_eglDisplay, m_eglConfig, config.type, config.resetNotificationStrategy);

	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

	// Init core functions

	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_get_all_proc_addresses"))
	{
		// Use eglGetProcAddress() for core functions
		GetProcFuncLoader funcLoader(egl);
		glu::initCoreFunctions(&m_glFunctions, &funcLoader, config.type.getAPI());
	}
#if defined(DEQP_GLES2_DIRECT_LINK)
	else if (config.type.getAPI() == glu::ApiType::es(2,0))
	{
		glw::initES20Direct(&m_glFunctions);
	}
#endif
#if defined(DEQP_GLES3_DIRECT_LINK)
	else if (config.type.getAPI() == glu::ApiType::es(3,0))
	{
		glw::initES30Direct(&m_glFunctions);
	}
#endif
#if defined(DEQP_GLES31_DIRECT_LINK)
	else if (config.type.getAPI() == glu::ApiType::es(3,1))
	{
		glw::initES31Direct(&m_glFunctions);
	}
#endif
#if defined(DEQP_GLES32_DIRECT_LINK)
	else if (config.type.getAPI() == glu::ApiType::es(3,2))
	{
		glw::initES32Direct(&m_glFunctions);
	}
#endif
	else
	{
		const char* libraryPath = DE_NULL;

		if (glu::isContextTypeES(config.type))
		{
			if (config.type.getMinorVersion() <= 2)
				libraryPath = DEQP_GLES2_LIBRARY_PATH;
			else
				libraryPath = DEQP_GLES3_LIBRARY_PATH;
		}
		else
			libraryPath = DEQP_OPENGL_LIBRARY_PATH;

		m_dynamicGLLibrary = new de::DynamicLibrary(libraryPath);

		DynamicFuncLoader funcLoader(m_dynamicGLLibrary);
		glu::initCoreFunctions(&m_glFunctions, &funcLoader, config.type.getAPI());
	}